

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-bitmap.h
# Opt level: O2

int bitmap_and_compl(bitmap_t dst,bitmap_t src1,bitmap_t src2)

{
  int iVar1;
  
  iVar1 = bitmap_op2(dst,src1,src2,bitmap_el_and_compl);
  return iVar1;
}

Assistant:

static inline int bitmap_and_compl (bitmap_t dst, bitmap_t src1, bitmap_t src2) {
  return bitmap_op2 (dst, src1, src2, bitmap_el_and_compl);
}